

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O1

void __thiscall
cbtAxisSweep3Internal<unsigned_int>::cbtAxisSweep3Internal
          (cbtAxisSweep3Internal<unsigned_int> *this,cbtVector3 *worldAabbMin,
          cbtVector3 *worldAabbMax,uint handleMask,uint handleSentinel,uint userMaxHandles,
          cbtOverlappingPairCache *pairCache,bool disableRaycastAccelerator)

{
  uint uVar1;
  Edge *pEVar2;
  undefined8 uVar3;
  cbtHashedOverlappingPairCache *this_00;
  cbtOverlappingPairCache *pcVar4;
  cbtDbvtBroadphase *this_01;
  Handle *pHVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  size_t size;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [12];
  undefined1 in_ZMM3 [64];
  
  auVar10 = in_ZMM3._0_16_;
  (this->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface =
       (_func_int **)&PTR__cbtAxisSweep3Internal_00b6f2d8;
  this->m_bpHandleMask = handleMask;
  this->m_handleSentinel = handleSentinel;
  this->m_pairCache = pairCache;
  this->m_userPairCallback = (cbtOverlappingPairCallback *)0x0;
  this->m_ownsPairCache = false;
  this->m_invalidPair = 0;
  this->m_raycastAccelerator = (cbtDbvtBroadphase *)0x0;
  if (pairCache == (cbtOverlappingPairCache *)0x0) {
    this_00 = (cbtHashedOverlappingPairCache *)cbtAlignedAllocInternal(0x78,0x10);
    cbtHashedOverlappingPairCache::cbtHashedOverlappingPairCache(this_00);
    this->m_pairCache = (cbtOverlappingPairCache *)this_00;
    this->m_ownsPairCache = true;
  }
  uVar1 = userMaxHandles + 1;
  if (!disableRaycastAccelerator) {
    pcVar4 = (cbtOverlappingPairCache *)cbtAlignedAllocInternal(0x28,0x10);
    (pcVar4->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar4[1].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar4[2].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar4[3].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar4[4].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    (pcVar4->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback =
         (_func_int **)&PTR__cbtNullPairCache_00b6f1f8;
    *(undefined1 *)&pcVar4[4].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = 1;
    pcVar4[3].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    *(undefined8 *)
     ((long)&pcVar4[1].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback + 4) = 0;
    this->m_nullPairCache = pcVar4;
    this_01 = (cbtDbvtBroadphase *)cbtAlignedAllocInternal(0x100,0x10);
    cbtDbvtBroadphase::cbtDbvtBroadphase(this_01,this->m_nullPairCache);
    this->m_raycastAccelerator = this_01;
    this_01->m_deferedcollide = true;
  }
  uVar3 = *(undefined8 *)(worldAabbMin->m_floats + 2);
  *(undefined8 *)(this->m_worldAabbMin).m_floats = *(undefined8 *)worldAabbMin->m_floats;
  *(undefined8 *)((this->m_worldAabbMin).m_floats + 2) = uVar3;
  uVar3 = *(undefined8 *)(worldAabbMax->m_floats + 2);
  *(undefined8 *)(this->m_worldAabbMax).m_floats = *(undefined8 *)worldAabbMax->m_floats;
  *(undefined8 *)((this->m_worldAabbMax).m_floats + 2) = uVar3;
  auVar10 = vcvtusi2ss_avx512f(auVar10,this->m_handleSentinel);
  fVar12 = auVar10._0_4_;
  auVar9._0_4_ = fVar12 / ((this->m_worldAabbMax).m_floats[0] - (this->m_worldAabbMin).m_floats[0]);
  auVar13 = auVar10._4_12_;
  auVar9._4_12_ = auVar13;
  auVar10._0_4_ = fVar12 / ((this->m_worldAabbMax).m_floats[1] - (this->m_worldAabbMin).m_floats[1])
  ;
  auVar10._4_12_ = auVar13;
  auVar10 = vinsertps_avx(auVar9,auVar10,0x10);
  auVar11._0_4_ = fVar12 / ((this->m_worldAabbMax).m_floats[2] - (this->m_worldAabbMin).m_floats[2])
  ;
  auVar11._4_12_ = auVar13;
  auVar10 = vinsertps_avx(auVar10,auVar11,0x28);
  *(undefined1 (*) [16])(this->m_quantize).m_floats = auVar10;
  size = (ulong)uVar1 * 0x58;
  pHVar5 = (Handle *)cbtAlignedAllocInternal(size,0x10);
  if (uVar1 != 0) {
    lVar8 = 0;
    do {
      *(undefined8 *)((long)(pHVar5->super_cbtBroadphaseProxy).m_aabbMin.m_floats + lVar8 + -0x14) =
           0;
      lVar8 = lVar8 + 0x58;
    } while (size - lVar8 != 0);
  }
  this->m_pHandles = pHVar5;
  this->m_maxHandles = uVar1;
  this->m_numHandles = 0;
  this->m_firstFreeHandle = 1;
  if (1 < uVar1) {
    iVar7 = 2;
    lVar8 = 0;
    do {
      *(int *)((long)(&pHVar5[1].super_cbtBroadphaseProxy.m_aabbMax + 1) + lVar8) = iVar7;
      lVar8 = lVar8 + 0x58;
      iVar7 = iVar7 + 1;
    } while (size - 0x58 != lVar8);
  }
  *(undefined4 *)&pHVar5[userMaxHandles].super_cbtBroadphaseProxy.field_0x34 = 0;
  lVar8 = -3;
  do {
    pvVar6 = cbtAlignedAllocInternal((ulong)uVar1 << 4,0x10);
    this->m_pEdgesRawPtr[lVar8 + 3] = pvVar6;
    this->m_pEdgesRawPtr[lVar8] = pvVar6;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0);
  pHVar5 = this->m_pHandles;
  (pHVar5->super_cbtBroadphaseProxy).m_clientObject = (void *)0x0;
  lVar8 = 0;
  do {
    *(undefined4 *)((long)(&(pHVar5->super_cbtBroadphaseProxy).m_aabbMax + 1) + lVar8 * 4) = 0;
    pHVar5->m_maxEdges[lVar8] = 1;
    pEVar2 = this->m_pEdges[lVar8];
    pEVar2->m_pos = 0;
    pEVar2->m_handle = 0;
    pEVar2[1].m_pos = this->m_handleSentinel;
    pEVar2[1].m_handle = 0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  return;
}

Assistant:

cbtAxisSweep3Internal<BP_FP_INT_TYPE>::cbtAxisSweep3Internal(const cbtVector3& worldAabbMin, const cbtVector3& worldAabbMax, BP_FP_INT_TYPE handleMask, BP_FP_INT_TYPE handleSentinel, BP_FP_INT_TYPE userMaxHandles, cbtOverlappingPairCache* pairCache, bool disableRaycastAccelerator)
	: m_bpHandleMask(handleMask),
	  m_handleSentinel(handleSentinel),
	  m_pairCache(pairCache),
	  m_userPairCallback(0),
	  m_ownsPairCache(false),
	  m_invalidPair(0),
	  m_raycastAccelerator(0)
{
	BP_FP_INT_TYPE maxHandles = static_cast<BP_FP_INT_TYPE>(userMaxHandles + 1);  //need to add one sentinel handle

	if (!m_pairCache)
	{
		void* ptr = cbtAlignedAlloc(sizeof(cbtHashedOverlappingPairCache), 16);
		m_pairCache = new (ptr) cbtHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	if (!disableRaycastAccelerator)
	{
		m_nullPairCache = new (cbtAlignedAlloc(sizeof(cbtNullPairCache), 16)) cbtNullPairCache();
		m_raycastAccelerator = new (cbtAlignedAlloc(sizeof(cbtDbvtBroadphase), 16)) cbtDbvtBroadphase(m_nullPairCache);  //m_pairCache);
		m_raycastAccelerator->m_deferedcollide = true;                                                                //don't add/remove pairs
	}

	//cbtAssert(bounds.HasVolume());

	// init bounds
	m_worldAabbMin = worldAabbMin;
	m_worldAabbMax = worldAabbMax;

	cbtVector3 aabbSize = m_worldAabbMax - m_worldAabbMin;

	BP_FP_INT_TYPE maxInt = m_handleSentinel;

	m_quantize = cbtVector3(cbtScalar(maxInt), cbtScalar(maxInt), cbtScalar(maxInt)) / aabbSize;

	// allocate handles buffer, using cbtAlignedAlloc, and put all handles on free list
	m_pHandles = new Handle[maxHandles];

	m_maxHandles = maxHandles;
	m_numHandles = 0;

	// handle 0 is reserved as the null index, and is also used as the sentinel
	m_firstFreeHandle = 1;
	{
		for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < maxHandles; i++)
			m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
		m_pHandles[maxHandles - 1].SetNextFree(0);
	}

	{
		// allocate edge buffers
		for (int i = 0; i < 3; i++)
		{
			m_pEdgesRawPtr[i] = cbtAlignedAlloc(sizeof(Edge) * maxHandles * 2, 16);
			m_pEdges[i] = new (m_pEdgesRawPtr[i]) Edge[maxHandles * 2];
		}
	}
	//removed overlap management

	// make boundary sentinels

	m_pHandles[0].m_clientObject = 0;

	for (int axis = 0; axis < 3; axis++)
	{
		m_pHandles[0].m_minEdges[axis] = 0;
		m_pHandles[0].m_maxEdges[axis] = 1;

		m_pEdges[axis][0].m_pos = 0;
		m_pEdges[axis][0].m_handle = 0;
		m_pEdges[axis][1].m_pos = m_handleSentinel;
		m_pEdges[axis][1].m_handle = 0;
#ifdef DEBUG_BROADPHASE
		debugPrintAxis(axis);
#endif  //DEBUG_BROADPHASE
	}
}